

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-util.c
# Opt level: O2

void borg_sort_swap_hook(void *u,void *v,int a,int b)

{
  undefined2 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  char **text;
  
  lVar3 = (long)a;
  uVar2 = *(undefined8 *)((long)u + lVar3 * 8);
  lVar4 = (long)b;
  *(undefined8 *)((long)u + lVar3 * 8) = *(undefined8 *)((long)u + lVar4 * 8);
  *(undefined8 *)((long)u + lVar4 * 8) = uVar2;
  uVar1 = *(undefined2 *)((long)v + lVar3 * 2);
  *(undefined2 *)((long)v + lVar3 * 2) = *(undefined2 *)((long)v + lVar4 * 2);
  *(undefined2 *)((long)v + lVar4 * 2) = uVar1;
  return;
}

Assistant:

void borg_sort_swap_hook(void *u, void *v, int a, int b)
{
    char   **text = (char **)(u);
    int16_t *what = (int16_t *)(v);

    char   *texttmp;
    int16_t whattmp;

    /* Swap "text" */
    texttmp = text[a];
    text[a] = text[b];
    text[b] = texttmp;

    /* Swap "what" */
    whattmp = what[a];
    what[a] = what[b];
    what[b] = whattmp;
}